

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-test.cc
# Opt level: O0

void __thiscall ExprTest_UnaryExpr_Test::TestBody(ExprTest_UnaryExpr_Test *this)

{
  bool bVar1;
  AssertHelper *this_00;
  AssertionFailure *e_2;
  bool gtest_caught_expected_1;
  string gtest_expected_message_1;
  AssertionResult gtest_ar_3;
  AssertionFailure *e_1;
  bool gtest_caught_expected;
  string gtest_expected_message;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar__1;
  NumericConstant arg;
  AssertionResult gtest_ar_;
  UnaryExpr e;
  undefined4 in_stack_fffffffffffffcd8;
  Kind in_stack_fffffffffffffcdc;
  ExprTest *in_stack_fffffffffffffce0;
  ExprBase in_stack_fffffffffffffce8;
  ExprBase in_stack_fffffffffffffcf0;
  undefined4 in_stack_fffffffffffffcf8;
  int in_stack_fffffffffffffcfc;
  char *in_stack_fffffffffffffd00;
  undefined4 in_stack_fffffffffffffd08;
  Type in_stack_fffffffffffffd0c;
  AssertionResult *in_stack_fffffffffffffd10;
  char *in_stack_fffffffffffffd18;
  undefined7 in_stack_fffffffffffffd20;
  undefined1 in_stack_fffffffffffffd27;
  char *in_stack_fffffffffffffd40;
  char *in_stack_fffffffffffffd48;
  char *in_stack_fffffffffffffd50;
  AssertionResult *in_stack_fffffffffffffd58;
  AssertHelper *in_stack_fffffffffffffd60;
  allocator<char> local_1c9;
  string local_1c8 [32];
  AssertionResult local_1a8 [3];
  int local_174;
  BasicExpr<(mp::expr::Kind)4,_(mp::expr::Kind)24> local_170;
  Impl *local_168;
  byte local_152;
  allocator<char> local_151;
  string local_150 [32];
  AssertionResult local_130 [2];
  ExprBase local_110;
  AssertionResult local_108 [2];
  Kind local_e8;
  undefined4 local_e4;
  AssertionResult local_e0;
  string local_d0 [48];
  AssertionResult local_a0;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1> local_90;
  BasicExpr<(mp::expr::Kind)4,_(mp::expr::Kind)24> local_80;
  Impl *local_78;
  Impl *local_70;
  string local_60 [64];
  AssertionResult local_20;
  ExprBase local_10 [2];
  
  mp::
  BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)4,_(mp::expr::Kind)24>
  ::BasicUnaryExpr((BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)4,_(mp::expr::Kind)24>
                    *)0x11b6a4);
  mp::internal::ExprBase::operator_cast_to_function_pointer(local_10);
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)in_stack_fffffffffffffce0,SUB41(in_stack_fffffffffffffcdc >> 0x18,0)
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_20);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffd10);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
               in_stack_fffffffffffffd40);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffd10,in_stack_fffffffffffffd0c,
               in_stack_fffffffffffffd00,in_stack_fffffffffffffcfc,
               (char *)in_stack_fffffffffffffcf0.impl_);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffd60,(Message *)in_stack_fffffffffffffd58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffce0);
    std::__cxx11::string::~string(local_60);
    testing::Message::~Message((Message *)0x11b7c5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11b840);
  local_70 = local_10[0].impl_;
  mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>::
  BasicExpr<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)4,(mp::expr::Kind)24>>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)in_stack_fffffffffffffce8.impl_,
             (BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)4,_(mp::expr::Kind)24>
              )in_stack_fffffffffffffcf0.impl_,
             (type_conflict)((ulong)in_stack_fffffffffffffce0 >> 0x20));
  local_90.super_ExprBase.impl_ =
       (ExprBase)
       mp::BasicExprFactory<std::allocator<char>_>::MakeNumericConstant
                 ((BasicExprFactory<std::allocator<char>_> *)in_stack_fffffffffffffce8.impl_,
                  (double)in_stack_fffffffffffffce0);
  local_78 = (Impl *)local_90.super_ExprBase.impl_;
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr<mp::NumericConstant>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)in_stack_fffffffffffffce8.impl_,
             (NumericConstant)in_stack_fffffffffffffcf0.impl_,
             (type_conflict)((ulong)in_stack_fffffffffffffce0 >> 0x20));
  local_80.super_ExprBase.impl_ =
       (ExprBase)
       ExprTest::MakeUnary(in_stack_fffffffffffffce0,in_stack_fffffffffffffcdc,
                           (NumericExpr)in_stack_fffffffffffffce8.impl_);
  local_10[0].impl_ = (Impl *)local_80.super_ExprBase.impl_;
  mp::internal::ExprBase::operator_cast_to_function_pointer(local_10);
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)in_stack_fffffffffffffce0,SUB41(in_stack_fffffffffffffcdc >> 0x18,0)
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_a0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffd10);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
               in_stack_fffffffffffffd40);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffd10,in_stack_fffffffffffffd0c,
               in_stack_fffffffffffffd00,in_stack_fffffffffffffcfc,
               (char *)in_stack_fffffffffffffcf0.impl_);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffd60,(Message *)in_stack_fffffffffffffd58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffce0);
    std::__cxx11::string::~string(local_d0);
    testing::Message::~Message((Message *)0x11ba14);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11ba8f);
  local_e4 = 5;
  local_e8 = mp::internal::ExprBase::kind((ExprBase *)0x11baa7);
  testing::internal::EqHelper<false>::Compare<mp::expr::Kind,mp::expr::Kind>
            ((char *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8),
             (char *)in_stack_fffffffffffffcf0.impl_,&(in_stack_fffffffffffffce8.impl_)->kind_,
             (Kind *)in_stack_fffffffffffffce0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_e0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffd10);
    testing::AssertionResult::failure_message((AssertionResult *)0x11bb50);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffd10,in_stack_fffffffffffffd0c,
               in_stack_fffffffffffffd00,in_stack_fffffffffffffcfc,
               (char *)in_stack_fffffffffffffcf0.impl_);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffd60,(Message *)in_stack_fffffffffffffd58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffce0);
    testing::Message::~Message((Message *)0x11bbb3);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11bc08);
  local_110.impl_ =
       (Impl *)mp::
               BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)4,_(mp::expr::Kind)24>
               ::arg((BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)4,_(mp::expr::Kind)24>
                      *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
  testing::internal::EqHelper<false>::
  Compare<mp::NumericConstant,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
            ((char *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8),
             (char *)in_stack_fffffffffffffcf0.impl_,
             (NumericConstant *)in_stack_fffffffffffffce8.impl_,
             (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)in_stack_fffffffffffffce0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_108);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffd10);
    testing::AssertionResult::failure_message((AssertionResult *)0x11bcbf);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffd10,in_stack_fffffffffffffd0c,
               in_stack_fffffffffffffd00,in_stack_fffffffffffffcfc,
               (char *)in_stack_fffffffffffffcf0.impl_);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffd60,(Message *)in_stack_fffffffffffffd58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffce0);
    testing::Message::~Message((Message *)0x11bd22);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11bd7a);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_130);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20),
               in_stack_fffffffffffffd18,(allocator<char> *)in_stack_fffffffffffffd10);
    std::allocator<char>::~allocator(&local_151);
    local_152 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_168 = local_78;
      mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr<mp::NumericConstant>
                ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)in_stack_fffffffffffffce8.impl_
                 ,(NumericConstant)in_stack_fffffffffffffcf0.impl_,
                 (type_conflict)((ulong)in_stack_fffffffffffffce0 >> 0x20));
      local_170.super_ExprBase.impl_ =
           (ExprBase)
           ExprTest::MakeUnary(in_stack_fffffffffffffce0,in_stack_fffffffffffffcdc,
                               (NumericExpr)in_stack_fffffffffffffce8.impl_);
    }
    if ((local_152 & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_fffffffffffffd10,
                 (char (*) [111])CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
      local_174 = 2;
    }
    else {
      local_174 = 0;
    }
    std::__cxx11::string::~string(local_150);
    if (local_174 != 0) goto LAB_0011c13b;
  }
  else {
LAB_0011c13b:
    testing::Message::Message((Message *)in_stack_fffffffffffffd10);
    testing::AssertionResult::failure_message((AssertionResult *)0x11c157);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffd10,in_stack_fffffffffffffd0c,
               in_stack_fffffffffffffd00,in_stack_fffffffffffffcfc,
               (char *)in_stack_fffffffffffffcf0.impl_);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffd60,(Message *)in_stack_fffffffffffffd58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffce0);
    testing::Message::~Message((Message *)0x11c1b4);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11c20c);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1a8);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20),
               in_stack_fffffffffffffd18,(allocator<char> *)in_stack_fffffffffffffd10);
    std::allocator<char>::~allocator(&local_1c9);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr
                ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)0x11c2a2);
      ExprTest::MakeUnary(in_stack_fffffffffffffce0,in_stack_fffffffffffffcdc,
                          (NumericExpr)in_stack_fffffffffffffce8.impl_);
    }
    testing::AssertionResult::operator<<
              (in_stack_fffffffffffffd10,
               (char (*) [121])CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
    local_174 = 3;
    std::__cxx11::string::~string(local_1c8);
    if (local_174 == 0) goto LAB_0011c63e;
  }
  testing::Message::Message((Message *)in_stack_fffffffffffffd10);
  this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x11c599);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)in_stack_fffffffffffffd10,in_stack_fffffffffffffd0c,
             in_stack_fffffffffffffd00,in_stack_fffffffffffffcfc,
             (char *)in_stack_fffffffffffffcf0.impl_);
  testing::internal::AssertHelper::operator=
            (in_stack_fffffffffffffd60,(Message *)in_stack_fffffffffffffd58);
  testing::internal::AssertHelper::~AssertHelper(this_00);
  testing::Message::~Message((Message *)0x11c5f6);
LAB_0011c63e:
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11c64b);
  return;
}

Assistant:

TEST_F(ExprTest, UnaryExpr) {
  mp::UnaryExpr e;
  EXPECT_TRUE(e == 0);
  (void)NumericExpr(e);
  auto arg = factory_.MakeNumericConstant(42);
  e = MakeUnary(expr::ABS, arg);
  EXPECT_TRUE(e != 0);
  EXPECT_EQ(expr::ABS, e.kind());
  EXPECT_EQ(arg, e.arg());
  EXPECT_ASSERT(MakeUnary(expr::ADD, arg), "invalid expression kind");
  EXPECT_ASSERT(MakeUnary(expr::ABS, NumericExpr()),
                "invalid argument");
}